

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

string * __thiscall
cmTarget::GetCompilePDBDirectory(string *__return_storage_ptr__,cmTarget *this,string *config)

{
  allocator local_29;
  string *local_28;
  CompileInfo *info;
  string *config_local;
  cmTarget *this_local;
  
  info = (CompileInfo *)config;
  config_local = (string *)this;
  this_local = (cmTarget *)__return_storage_ptr__;
  local_28 = (string *)GetCompileInfo(this,config);
  if (local_28 == (string *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmTarget::GetCompilePDBDirectory(const std::string& config) const
{
  if(CompileInfo const* info = this->GetCompileInfo(config))
    {
    return info->CompilePdbDir;
    }
  return "";
}